

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

bool __thiscall Js::ScriptContext::IsTrackedPropertyId(ScriptContext *this,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  JavascriptLibrary *this_00;
  ReferencedPropertyRecordHashSet *this_01;
  bool local_39;
  ReferencedPropertyRecordHashSet *referencedPropertyRecords;
  PropertyRecord *propertyRecord;
  ScriptContext *pSStack_18;
  PropertyId propertyId_local;
  ScriptContext *this_local;
  
  propertyRecord._4_4_ = propertyId;
  pSStack_18 = this;
  BVar3 = IsBuiltInPropertyId(propertyId);
  if (BVar3 == 0) {
    referencedPropertyRecords =
         (ReferencedPropertyRecordHashSet *)GetPropertyName(this,propertyRecord._4_4_);
    if ((PropertyRecord *)referencedPropertyRecords == (PropertyRecord *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x674,"(propertyRecord != nullptr)","propertyRecord != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    bVar2 = PropertyRecord::IsBound((PropertyRecord *)referencedPropertyRecords);
    if (bVar2) {
      this_local._7_1_ = true;
    }
    else {
      this_00 = GetLibrary(this);
      this_01 = JavascriptLibrary::GetReferencedPropertyRecordList(this_00);
      local_39 = false;
      if (this_01 != (ReferencedPropertyRecordHashSet *)0x0) {
        local_39 = JsUtil::
                   BaseHashSet<const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_const_Js::PropertyRecord_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ::Contains(this_01,(PropertyRecord **)&referencedPropertyRecords);
      }
      this_local._7_1_ = local_39;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ScriptContext::IsTrackedPropertyId(Js::PropertyId propertyId)
    {
        if (IsBuiltInPropertyId(propertyId))
        {
            return true;
        }
        const PropertyRecord* propertyRecord = this->GetPropertyName(propertyId);
        Assert(propertyRecord != nullptr);
        if (propertyRecord->IsBound())
        {
            return true;
        }
        JavascriptLibrary::ReferencedPropertyRecordHashSet * referencedPropertyRecords
            = this->GetLibrary()->GetReferencedPropertyRecordList();
        return referencedPropertyRecords && referencedPropertyRecords->Contains(propertyRecord);
    }